

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void duckdb::TemplatedWritePlain<long,long,duckdb::ParquetCastOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  WriteStream *pWVar1;
  WriteStream *pWVar2;
  idx_t iVar3;
  
  if (chunk_start <= chunk_end && chunk_end - chunk_start != 0) {
    ser = (WriteStream *)stats[1]._vptr_ColumnWriterStatistics;
    pWVar2 = (WriteStream *)stats[2]._vptr_ColumnWriterStatistics;
    iVar3 = chunk_start;
    do {
      pWVar1 = *(WriteStream **)(&col->vector_type + iVar3 * 8);
      if ((long)pWVar1 < (long)ser) {
        stats[1]._vptr_ColumnWriterStatistics = (_func_int **)pWVar1;
        ser = pWVar1;
      }
      if ((long)pWVar2 < (long)pWVar1) {
        stats[2]._vptr_ColumnWriterStatistics = (_func_int **)pWVar1;
        pWVar2 = pWVar1;
      }
      iVar3 = iVar3 + 1;
    } while (chunk_end != iVar3);
  }
  (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)
            (mask,&col->vector_type + chunk_start * 8,(chunk_end - chunk_start) * 8,chunk_end,mask,
             ser);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}